

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__pic_info(stbi__context *s,int *x,int *y,int *comp)

{
  byte bVar1;
  stbi_uc sVar2;
  int iVar3;
  long lVar4;
  stbi__pic_packet *packet;
  stbi__pic_packet packets [10];
  int local_40;
  uint local_3c;
  int dummy;
  int chained;
  int num_packets;
  int act_comp;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  chained = 0;
  dummy = 0;
  y_local = x;
  if (x == (int *)0x0) {
    y_local = &local_40;
  }
  comp_local = y;
  if (y == (int *)0x0) {
    comp_local = &local_40;
  }
  _num_packets = comp;
  if (comp == (int *)0x0) {
    _num_packets = &local_40;
  }
  x_local = (int *)s;
  iVar3 = stbi__pic_is4(s,anon_var_dwarf_ecf0);
  if (iVar3 == 0) {
    stbi__rewind((stbi__context *)x_local);
    s_local._4_4_ = 0;
  }
  else {
    stbi__skip((stbi__context *)x_local,0x58);
    iVar3 = stbi__get16be((stbi__context *)x_local);
    *y_local = iVar3;
    iVar3 = stbi__get16be((stbi__context *)x_local);
    *comp_local = iVar3;
    iVar3 = stbi__at_eof((stbi__context *)x_local);
    if (iVar3 == 0) {
      if ((*y_local == 0) || (*comp_local <= (int)(0x10000000 / (long)*y_local))) {
        stbi__skip((stbi__context *)x_local,8);
        do {
          if (dummy == 10) {
            return 0;
          }
          lVar4 = (long)dummy;
          dummy = dummy + 1;
          bVar1 = stbi__get8((stbi__context *)x_local);
          local_3c = (uint)bVar1;
          sVar2 = stbi__get8((stbi__context *)x_local);
          packets[lVar4 + -3].type = sVar2;
          sVar2 = stbi__get8((stbi__context *)x_local);
          packets[lVar4 + -3].channel = sVar2;
          sVar2 = stbi__get8((stbi__context *)x_local);
          packets[lVar4 + -2].size = sVar2;
          chained = (uint)packets[lVar4 + -2].size | chained;
          iVar3 = stbi__at_eof((stbi__context *)x_local);
          if (iVar3 != 0) {
            stbi__rewind((stbi__context *)x_local);
            return 0;
          }
          if (packets[lVar4 + -3].type != '\b') {
            stbi__rewind((stbi__context *)x_local);
            return 0;
          }
        } while (local_3c != 0);
        iVar3 = 3;
        if ((chained & 0x10U) != 0) {
          iVar3 = 4;
        }
        *_num_packets = iVar3;
        s_local._4_4_ = 1;
      }
      else {
        stbi__rewind((stbi__context *)x_local);
        s_local._4_4_ = 0;
      }
    }
    else {
      stbi__rewind((stbi__context *)x_local);
      s_local._4_4_ = 0;
    }
  }
  return s_local._4_4_;
}

Assistant:

static int stbi__pic_info(stbi__context *s, int *x, int *y, int *comp)
{
   int act_comp=0,num_packets=0,chained,dummy;
   stbi__pic_packet packets[10];

   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;

   if (!stbi__pic_is4(s,"\x53\x80\xF6\x34")) {
      stbi__rewind(s);
      return 0;
   }

   stbi__skip(s, 88);

   *x = stbi__get16be(s);
   *y = stbi__get16be(s);
   if (stbi__at_eof(s)) {
      stbi__rewind( s);
      return 0;
   }
   if ( (*x) != 0 && (1 << 28) / (*x) < (*y)) {
      stbi__rewind( s );
      return 0;
   }

   stbi__skip(s, 8);

   do {
      stbi__pic_packet *packet;

      if (num_packets==sizeof(packets)/sizeof(packets[0]))
         return 0;

      packet = &packets[num_packets++];
      chained = stbi__get8(s);
      packet->size    = stbi__get8(s);
      packet->type    = stbi__get8(s);
      packet->channel = stbi__get8(s);
      act_comp |= packet->channel;

      if (stbi__at_eof(s)) {
          stbi__rewind( s );
          return 0;
      }
      if (packet->size != 8) {
          stbi__rewind( s );
          return 0;
      }
   } while (chained);

   *comp = (act_comp & 0x10 ? 4 : 3);

   return 1;
}